

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_clear(JSON_Array *array)

{
  size_t sVar1;
  JSON_Value *value;
  ulong local_20;
  size_t i;
  JSON_Array *array_local;
  
  if (array == (JSON_Array *)0x0) {
    array_local._4_4_ = -1;
  }
  else {
    local_20 = 0;
    while( true ) {
      sVar1 = json_array_get_count(array);
      if (sVar1 <= local_20) break;
      value = json_array_get_value(array,local_20);
      json_value_free(value);
      local_20 = local_20 + 1;
    }
    array->count = 0;
    array_local._4_4_ = 0;
  }
  return array_local._4_4_;
}

Assistant:

JSON_Status json_array_clear(JSON_Array *array) {
    size_t i = 0;
    if (array == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_array_get_count(array); i++) {
        json_value_free(json_array_get_value(array, i));
    }
    array->count = 0;
    return JSONSuccess;
}